

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::createUnaryOp(Builder *this,Op opCode,Id typeId,Id operand)

{
  Id IVar1;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  allocator_type local_65;
  Id operand_local;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_58;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_40;
  
  operand_local = operand;
  if (this->generatingOpCodeForSpecConst == true) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_40,1,
               &operand_local,&local_65);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    IVar1 = createSpecConstantOp
                      (this,opCode,typeId,(Vector<Id> *)&local_40,(Vector<unsigned_int> *)&local_58)
    ;
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_58);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_40);
  }
  else {
    this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         dxil_spv::allocate_in_thread(0x38);
    IVar1 = this->uniqueId + 1;
    this->uniqueId = IVar1;
    *(undefined ***)
     this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001e31e0;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar1;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = typeId;
    *(Op *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = opCode;
    (((Vector<Id> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    *(Block **)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = (Block *)0x0;
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,operand);
    local_60._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    Block::addInstruction
              (this->buildPoint,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_60);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_60._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_60._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    IVar1 = *(Id *)((long)this_00.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
  }
  return IVar1;
}

Assistant:

Id Builder::createUnaryOp(Op opCode, Id typeId, Id operand)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        return createSpecConstantOp(opCode, typeId, dxil_spv::Vector<Id>(1, operand), dxil_spv::Vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->addIdOperand(operand);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}